

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleJitProfilingHelpers.cpp
# Opt level: O2

void Js::SimpleJitHelpers::StoreArrayHelper(Var arr,uint32 index,Var value)

{
  bool bVar1;
  Type TVar2;
  Type *pTVar3;
  ScriptContext *scriptContext;
  ThreadContext *pTVar4;
  JavascriptArray *this;
  
  this = JavascriptArray::FromAnyArray(arr);
  pTVar3 = (this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr;
  scriptContext = (((pTVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  pTVar4 = scriptContext->threadContext;
  bVar1 = pTVar4->noJsReentrancy;
  pTVar4->noJsReentrancy = true;
  TVar2 = pTVar3->typeId;
  if (TVar2 == TypeIds_ArrayLast) {
    JavascriptArray::OP_SetNativeFloatElementC
              ((JavascriptNativeFloatArray *)this,index,value,scriptContext);
  }
  else if (TVar2 == TypeIds_NativeIntArray) {
    JavascriptArray::OP_SetNativeIntElementC
              ((JavascriptNativeIntArray *)this,index,value,scriptContext);
  }
  else {
    JavascriptArray::SetArrayLiteralItem<void*>(this,index,value);
  }
  pTVar4->noJsReentrancy = bVar1;
  return;
}

Assistant:

void SimpleJitHelpers::StoreArrayHelper(Var arr, uint32 index, Var value)
    {
        //Adapted from InterpreterStackFrame::OP_SetArrayItemC_CI4
        JavascriptArray* array = JavascriptArray::FromAnyArray(arr);
        ScriptContext* scriptContext = array->GetScriptContext();
        JIT_HELPER_NOT_REENTRANT_HEADER(SimpleStoreArrayHelper, reentrancylock, scriptContext->GetThreadContext());

        TypeId typeId = array->GetTypeId();
        if (typeId == TypeIds_NativeIntArray)
        {
            JavascriptArray::OP_SetNativeIntElementC(reinterpret_cast<JavascriptNativeIntArray*>(array), index, value, array->GetScriptContext());
        }
        else if (typeId == TypeIds_NativeFloatArray)
        {
            JavascriptArray::OP_SetNativeFloatElementC(reinterpret_cast<JavascriptNativeFloatArray*>(array), index, value, array->GetScriptContext());
        }
        else
        {
            array->SetArrayLiteralItem(index, value);
        }
        JIT_HELPER_END(SimpleStoreArrayHelper);
    }